

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend.c
# Opt level: O2

axbStatus_t axbOpBackendSetName(axbOpBackend_s *ops,char *name)

{
  axbStatus_t aVar1;
  size_t sVar2;
  char *pcVar3;
  long lVar4;
  
  sVar2 = strlen(name);
  if (ops->name == (char *)0x0) {
    ops->name_capacity = sVar2 + 2;
    pcVar3 = (char *)malloc(sVar2 + 2);
    ops->name = pcVar3;
  }
  aVar1 = 0x2619;
  if (sVar2 < 9) {
    aVar1 = 0;
    for (lVar4 = 0; sVar2 + 1 != lVar4; lVar4 = lVar4 + 1) {
      ops->name[lVar4] = name[lVar4];
    }
  }
  return aVar1;
}

Assistant:

axbStatus_t axbOpBackendSetName(struct axbOpBackend_s *ops, const char *name)
{
  size_t len = strlen(name);
  if (!ops->name)
  {
    ops->name_capacity = len + 2;
    ops->name = malloc(ops->name_capacity);
  }

  if (len > sizeof(ops->name)) return 9753;  // op name too large
  for (size_t i=0; i<=len; ++i) ops->name[i] = name[i];

  return 0;
}